

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O0

void __thiscall DTextEnterMenu::Drawer(DTextEnterMenu *this)

{
  FFont *font;
  DFrameBuffer *pDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  EColorRange range;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32 uVar13;
  DMenu *pDVar14;
  undefined4 extraout_var;
  FRemapTable *pFVar15;
  bool bVar16;
  char *local_e8;
  char *str;
  uint32 palcolor;
  int palentry;
  int y2;
  int y1;
  int x2;
  int x1;
  FRemapTable *remap;
  EColorRange color;
  FTexture *pic;
  int ch;
  int xx;
  int width;
  int x;
  int yy;
  int y;
  int local_1c;
  uint local_18;
  int top_padding;
  int cell_height;
  int cell_width;
  DTextEnterMenu *this_local;
  
  _cell_height = this;
  pDVar14 = TObjPtr<DMenu>::operator->(&(this->super_DMenu).mParentMenu);
  (*(pDVar14->super_DObject)._vptr_DObject[10])();
  if ((this->mInputGridOkay & 1U) != 0) {
    top_padding = CleanXfac * 0x12;
    local_18 = CleanYfac * 0xc;
    iVar2 = (int)local_18 / 2;
    iVar3 = FFont::GetHeight(SmallFont);
    pDVar1 = screen;
    local_1c = iVar2 - (iVar3 * CleanYfac) / 2;
    PalEntry::PalEntry((PalEntry *)&y,0);
    iVar3 = DCanvas::GetHeight((DCanvas *)screen);
    iVar2 = local_18 * -5;
    uVar4 = DCanvas::GetWidth((DCanvas *)screen);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3f4ccccd,pDVar1,(ulong)(uint)y,0,(ulong)(uint)(iVar3 + iVar2),(ulong)uVar4,
               (ulong)(local_18 * 5));
    pDVar1 = screen;
    if ((-1 < this->InputGridX) && (-1 < this->InputGridY)) {
      PalEntry::PalEntry((PalEntry *)&yy,0xfff8dc);
      iVar3 = this->InputGridX * top_padding;
      iVar5 = top_padding * 0xd;
      iVar6 = DCanvas::GetWidth((DCanvas *)screen);
      iVar7 = this->InputGridY * local_18;
      iVar2 = local_18 * -5;
      iVar8 = DCanvas::GetHeight((DCanvas *)screen);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f19999a,pDVar1,(ulong)(uint)yy,(ulong)(uint)((iVar3 - iVar5 / 2) + iVar6 / 2),
                 (ulong)(uint)(iVar7 + iVar2 + iVar8),(ulong)(uint)top_padding,(ulong)local_18);
    }
    for (x = 0; x < 5; x = x + 1) {
      iVar3 = x * local_18;
      iVar2 = local_18 * -5;
      iVar5 = DCanvas::GetHeight((DCanvas *)screen);
      width = iVar3 + iVar2 + iVar5;
      for (xx = 0; xx < 0xd; xx = xx + 1) {
        iVar2 = xx * top_padding;
        iVar3 = top_padding * 0xd;
        iVar5 = DCanvas::GetWidth((DCanvas *)screen);
        iVar2 = (iVar2 - iVar3 / 2) + iVar5 / 2;
        uVar4 = (uint)"ABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789+-=.,!?@\'\":;[]()<>^#$%&*/_ \b"
                      [x * 0xd + xx];
        iVar3 = (*SmallFont->_vptr_FFont[2])(SmallFont,(ulong)uVar4,&ch);
        bVar16 = false;
        if (xx == this->InputGridX) {
          bVar16 = x == this->InputGridY;
        }
        range = CR_DARKGRAY;
        if (bVar16) {
          range = CR_YELLOW;
        }
        pFVar15 = FFont::GetColorTranslation(SmallFont,range);
        pDVar1 = screen;
        font = SmallFont;
        if ((FTexture *)CONCAT44(extraout_var,iVar3) == (FTexture *)0x0) {
          if (uVar4 == 0x20) {
            uVar4 = (iVar2 + top_padding / 2) - (ch * CleanXfac * 3) / 4;
            uVar9 = uVar4 + (ch * 3 * CleanXfac) / 2;
            uVar10 = width + local_1c;
            iVar2 = FFont::GetHeight(SmallFont);
            uVar11 = uVar10 + iVar2 * CleanYfac;
            uVar12 = (uint)pFVar15->Remap[(pFVar15->NumEntries << 1) / 3];
            uVar13 = PalEntry::operator_cast_to_unsigned_int
                               (pFVar15->Palette + (pFVar15->NumEntries << 1) / 3);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)uVar4,(ulong)uVar10,(ulong)uVar9,(ulong)(uVar10 + CleanYfac),
                       (ulong)uVar12,uVar13);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)uVar4,(ulong)uVar11,(ulong)uVar9,(ulong)(uVar11 + CleanYfac),
                       (ulong)uVar12,uVar13);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)uVar4,(ulong)(uVar10 + CleanYfac),(ulong)(uVar4 + CleanXfac),
                       (ulong)uVar11,(ulong)uVar12,uVar13);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)(uVar9 - CleanXfac),(ulong)(uVar10 + CleanYfac),(ulong)uVar9,
                       (ulong)uVar11,(ulong)uVar12,uVar13);
          }
          else if ((uVar4 == 8) || (uVar4 == 0)) {
            if (uVar4 == 8) {
              local_e8 = "BS";
            }
            else {
              local_e8 = "ED";
            }
            iVar5 = top_padding / 2;
            iVar3 = FFont::StringWidth(SmallFont,local_e8);
            DCanvas::DrawText((DCanvas *)pDVar1,font,range,(iVar2 + iVar5) - (iVar3 * CleanXfac) / 2
                              ,width + local_1c,local_e8,0x40001393,1,0);
          }
        }
        else {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,(FTexture *)CONCAT44(extraout_var,iVar3),
                     (double)((iVar2 + top_padding / 2) - (ch * CleanXfac) / 2),
                     (double)(width + local_1c),0x4000138e,pFVar15,0x40001393,1,0);
        }
      }
    }
  }
  DMenu::Drawer(&this->super_DMenu);
  return;
}

Assistant:

void DTextEnterMenu::Drawer ()
{
	mParentMenu->Drawer();
	if (mInputGridOkay)
	{
		const int cell_width = 18 * CleanXfac;
		const int cell_height = 12 * CleanYfac;
		const int top_padding = cell_height / 2 - SmallFont->GetHeight() * CleanYfac / 2;

		// Darken the background behind the character grid.
		// Unless we frame it with a border, I think it looks better to extend the
		// background across the full width of the screen.
		screen->Dim(0, 0.8f,
			0 /*screen->GetWidth()/2 - 13 * cell_width / 2*/,
			screen->GetHeight() - INPUTGRID_HEIGHT * cell_height,
			screen->GetWidth() /*13 * cell_width*/,
			INPUTGRID_HEIGHT * cell_height);

		if (InputGridX >= 0 && InputGridY >= 0)
		{
			// Highlight the background behind the selected character.
			screen->Dim(MAKERGB(255,248,220), 0.6f,
				InputGridX * cell_width - INPUTGRID_WIDTH * cell_width / 2 + screen->GetWidth() / 2,
				InputGridY * cell_height - INPUTGRID_HEIGHT * cell_height + screen->GetHeight(),
				cell_width, cell_height);
		}

		for (int y = 0; y < INPUTGRID_HEIGHT; ++y)
		{
			const int yy = y * cell_height - INPUTGRID_HEIGHT * cell_height + screen->GetHeight();
			for (int x = 0; x < INPUTGRID_WIDTH; ++x)
			{
				int width;
				const int xx = x * cell_width - INPUTGRID_WIDTH * cell_width / 2 + screen->GetWidth() / 2;
				const int ch = InputGridChars[y * INPUTGRID_WIDTH + x];
				FTexture *pic = SmallFont->GetChar(ch, &width);
				EColorRange color;
				FRemapTable *remap;

				// The highlighted character is yellow; the rest are dark gray.
				color = (x == InputGridX && y == InputGridY) ? CR_YELLOW : CR_DARKGRAY;
				remap = SmallFont->GetColorTranslation(color);

				if (pic != NULL)
				{
					// Draw a normal character.
					screen->DrawTexture(pic, xx + cell_width/2 - width*CleanXfac/2, yy + top_padding,
						DTA_Translation, remap,
						DTA_CleanNoMove, true,
						TAG_DONE);
				}
				else if (ch == ' ')
				{
					// Draw the space as a box outline. We also draw it 50% wider than it really is.
					const int x1 = xx + cell_width/2 - width * CleanXfac * 3 / 4;
					const int x2 = x1 + width * 3 * CleanXfac / 2;
					const int y1 = yy + top_padding;
					const int y2 = y1 + SmallFont->GetHeight() * CleanYfac;
					const int palentry = remap->Remap[remap->NumEntries*2/3];
					const uint32 palcolor = remap->Palette[remap->NumEntries*2/3];
					screen->Clear(x1, y1, x2, y1+CleanYfac, palentry, palcolor);	// top
					screen->Clear(x1, y2, x2, y2+CleanYfac, palentry, palcolor);	// bottom
					screen->Clear(x1, y1+CleanYfac, x1+CleanXfac, y2, palentry, palcolor);	// left
					screen->Clear(x2-CleanXfac, y1+CleanYfac, x2, y2, palentry, palcolor);	// right
				}
				else if (ch == '\b' || ch == 0)
				{
					// Draw the backspace and end "characters".
					const char *const str = ch == '\b' ? "BS" : "ED";
					screen->DrawText(SmallFont, color,
						xx + cell_width/2 - SmallFont->StringWidth(str)*CleanXfac/2,
						yy + top_padding, str, DTA_CleanNoMove, true, TAG_DONE);
				}
			}
		}
	}
	Super::Drawer();
}